

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall
lest::to_string<unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,lest *this,unsigned_long *lhs,string *op,
          unsigned_long *rhs)

{
  long *plVar1;
  ostream *poVar2;
  ulong *puVar3;
  ostringstream os;
  string local_230;
  ulong *local_210;
  size_type local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  pointer local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = *(ulong **)this;
  make_value_string<unsigned_long>(&local_230,(unsigned_long *)&local_1f0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_1d0 = (ulong *)*plVar1;
  puVar3 = (ulong *)(plVar1 + 2);
  if (local_1d0 == puVar3) {
    local_200 = *puVar3;
    lStack_1f8 = plVar1[3];
    local_1c8 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
LAB_002326c6:
    local_1d0 = &local_1c0;
    lStack_1b8 = lStack_1f8;
  }
  else {
    local_200 = plVar1[2];
    local_1c8 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_1d0 == &local_200) goto LAB_002326c6;
  }
  local_1c0 = local_200;
  local_208 = 0;
  local_200 = local_200 & 0xffffffffffffff00;
  local_210 = &local_200;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*lhs,lhs[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_1b0 = (op->_M_dataplus)._M_p;
  make_value_string<unsigned_long>(&local_230,(unsigned_long *)&local_1b0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_1f0 = (ulong *)*plVar1;
  puVar3 = (ulong *)(plVar1 + 2);
  if (local_1f0 == puVar3) {
    local_200 = *puVar3;
    lStack_1f8 = plVar1[3];
    local_1e8 = plVar1[1];
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  else {
    local_200 = plVar1[2];
    local_1e8 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_1f0 != &local_200) goto LAB_002327ff;
  }
  local_1f0 = &local_1e0;
  lStack_1d8 = lStack_1f8;
LAB_002327ff:
  local_1e0 = local_200;
  local_208 = 0;
  local_200 = local_200 & 0xffffffffffffff00;
  local_210 = &local_200;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1f0,local_1e8);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_210 == &local_200) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_200;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_1f8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_210;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_200;
  }
  __return_storage_ptr__->_M_string_length = local_208;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}